

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-to-vpack.cpp
# Opt level: O0

bool buildCompressedKeys(string *s,
                        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                        *keysFound)

{
  string_view json;
  Slice __f;
  shared_ptr<arangodb::velocypack::Builder> builder;
  Parser parser;
  Options options;
  Builder *in_stack_fffffffffffffee8;
  Options *in_stack_fffffffffffffef0;
  function<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice)> *func;
  undefined8 in_stack_fffffffffffffef8;
  undefined1 multi;
  Slice slice;
  Parser *this;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  Options *in_stack_ffffffffffffff18;
  undefined8 in_stack_ffffffffffffff20;
  Parser local_88;
  Parser local_48;
  byte local_1;
  
  multi = (undefined1)((ulong)in_stack_fffffffffffffef8 >> 0x38);
  slice._start = (uint8_t *)&local_48;
  arangodb::velocypack::Options::Options(in_stack_fffffffffffffef0);
  this = &local_88;
  arangodb::velocypack::Parser::Parser
            ((Parser *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  std::__cxx11::string::operator_cast_to_basic_string_view
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffef0);
  json._M_str._0_4_ = in_stack_ffffffffffffff10;
  json._M_len = (size_t)this;
  json._M_str._4_4_ = in_stack_ffffffffffffff14;
  arangodb::velocypack::Parser::parse((Parser *)slice._start,json,(bool)multi);
  arangodb::velocypack::Parser::steal(this);
  std::__shared_ptr_access<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1061f9);
  __f = arangodb::velocypack::Builder::slice(in_stack_fffffffffffffee8);
  func = (function<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice)> *)
         &stack0xffffffffffffff20;
  std::function<bool(arangodb::velocypack::Slice,arangodb::velocypack::Slice)>::
  function<buildCompressedKeys(std::__cxx11::string_const&,std::unordered_map<std::__cxx11::string,unsigned_long,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>&)::__0,void>
            ((function<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice)> *)
             slice._start,(anon_class_8_1_d327988e *)__f._start);
  arangodb::velocypack::Collection::visitRecursive
            (slice,(VisitationOrder)((ulong)__f._start >> 0x20),func);
  std::function<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice)>::~function
            ((function<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice)> *)0x106253);
  local_1 = 1;
  std::shared_ptr<arangodb::velocypack::Builder>::~shared_ptr
            ((shared_ptr<arangodb::velocypack::Builder> *)0x10626d);
  arangodb::velocypack::Parser::~Parser((Parser *)0x106301);
  return (bool)(local_1 & 1);
}

Assistant:

static bool buildCompressedKeys(
    std::string const& s, std::unordered_map<std::string, size_t>& keysFound) {
  Options options;
  Parser parser(&options);
  try {
    parser.parse(s);
    std::shared_ptr<Builder> builder = parser.steal();

    Collection::visitRecursive(
        builder->slice(), Collection::PreOrder,
        [&keysFound](Slice const& key, Slice const&) -> bool {
          if (key.isString()) {
            keysFound[key.copyString()]++;
          }
          return true;
        });

    return true;
  } catch (...) {
    // simply don't use compressed keys
    return false;
  }
}